

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::commit(raft_server *this,ulong target_idx)

{
  element_type *peVar1;
  _Hash_node_base *p_Var2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar4;
  __int_type_conflict _Var5;
  context *pcVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  nuraft_global_mgr *this_01;
  unique_lock<std::mutex> lock;
  ptr<peer> local_88;
  undefined1 local_78 [8];
  uint local_70;
  undefined4 uStack_6c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  element_type *local_58;
  Type local_4c;
  __shared_ptr<nuraft::raft_server,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  context *local_38;
  
  local_58 = (element_type *)target_idx;
  if ((this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i < target_idx) {
    LOCK();
    (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = target_idx;
    UNLOCK();
    LOCK();
    (this->lagging_sm_target_index_).super___atomic_base<unsigned_long>._M_i = target_idx;
    UNLOCK();
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1 != (element_type *)0x0) && (iVar8 = (*peVar1->_vptr_logger[7])(), 4 < iVar8)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_78,"trigger commit upto %lu",
                 (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i);
      (*peVar1->_vptr_logger[8])
                (peVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"commit",0x2d,(string *)local_78);
      if (local_78 != (undefined1  [8])&local_68) {
        operator_delete((void *)local_78);
      }
    }
    if ((this->role_)._M_i == leader) {
      for (p_Var2 = (this->peers_)._M_h._M_before_begin._M_nxt; p_Var2 != (_Hash_node_base *)0x0;
          p_Var2 = p_Var2->_M_nxt) {
        peVar3 = (element_type *)p_Var2[2]._M_nxt;
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2[3]._M_nxt;
        if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_88.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          local_88.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               this_00;
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
              goto LAB_00219cba;
            }
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
LAB_00219cba:
        local_88.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
        bVar7 = request_append_entries(this,&local_88);
        if (local_88.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (!bVar7) {
          LOCK();
          (peVar3->pending_commit_flag_)._M_base._M_i = true;
          UNLOCK();
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
      }
    }
  }
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1 != (element_type *)0x0) && (iVar8 = (*peVar1->_vptr_logger[7])(), 5 < iVar8)) {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar8 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_log_store[2])();
    msg_if_given_abi_cxx11_
              ((string *)local_78,
               "local log idx %lu, target_commit_idx %lu, quick_commit_index_ %lu, state_->get_commit_idx() %lu"
               ,CONCAT44(extraout_var,iVar8) + -1,local_58,
               (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i,
               (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i);
    (*peVar1->_vptr_logger[8])
              (peVar1,6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
               ,"commit",0x3f,(string *)local_78);
    if (local_78 != (undefined1  [8])&local_68) {
      operator_delete((void *)local_78);
    }
  }
  iVar8 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_log_store[2])();
  if (((this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i <
       CONCAT44(extraout_var_00,iVar8) - 1U) &&
     ((this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i <
      (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i)) {
    this_01 = nuraft_global_mgr::get_instance();
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_01 == (nuraft_global_mgr *)0x0) {
      if ((peVar1 != (element_type *)0x0) && (iVar8 = (*peVar1->_vptr_logger[7])(), 5 < iVar8)) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_((string *)local_78,"commit_cv_ notify (local thread)");
        (*peVar1->_vptr_logger[8])
                  (peVar1,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"commit",0x4a,(string *)local_78);
        if (local_78 != (undefined1  [8])&local_68) {
          operator_delete((void *)local_78);
        }
      }
      local_78 = (undefined1  [8])&this->commit_cv_lock_;
      local_70 = local_70 & 0xffffff00;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_78);
      local_70 = CONCAT31(local_70._1_3_,true);
      std::condition_variable::notify_one();
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_78);
    }
    else {
      if ((peVar1 != (element_type *)0x0) && (iVar8 = (*peVar1->_vptr_logger[7])(), 5 < iVar8)) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_((string *)local_78,"request commit to global thread pool");
        (*peVar1->_vptr_logger[8])
                  (peVar1,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"commit",0x47,(string *)local_78);
        if (local_78 != (undefined1  [8])&local_68) {
          operator_delete((void *)local_78);
        }
      }
      std::__shared_ptr<nuraft::raft_server,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<nuraft::raft_server,void>
                (local_48,(__weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2> *)
                          &this->super_enable_shared_from_this<nuraft::raft_server>);
      nuraft_global_mgr::request_commit(this_01,(ptr<raft_server> *)local_48);
      if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
      }
    }
  }
  else if ((this->role_)._M_i == follower) {
    uVar4 = (this->leader_commit_index_).super___atomic_base<unsigned_long>._M_i;
    _Var5 = (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i;
    if (((this->data_fresh_)._M_base._M_i & 1U) == 0) {
      context::get_params((context *)local_78);
      iVar8 = *(int *)((long)local_78 + 0x30);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_6c,local_70) !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_6c,local_70));
      }
      if (uVar4 < _Var5 + (long)iVar8) {
        LOCK();
        (this->data_fresh_)._M_base._M_i = true;
        UNLOCK();
        local_78._4_4_ = (this->leader_).super___atomic_base<int>._M_i;
        local_78._0_4_ = this->id_;
        local_70 = 0xffffffff;
        local_68._M_allocated_capacity = 0;
        pcVar6 = (this->ctx_)._M_t.
                 super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
                 super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
                 super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
        if ((pcVar6->cb_func_).func.super__Function_base._M_manager != (_Manager_type)0x0) {
          local_4c = BecomeFresh;
          local_38 = (context *)local_78;
          (*(pcVar6->cb_func_).func._M_invoker)
                    ((_Any_data *)&pcVar6->cb_func_,&local_4c,(Param **)&local_38);
        }
      }
    }
  }
  return;
}

Assistant:

void raft_server::commit(ulong target_idx) {
    if (target_idx > quick_commit_index_) {
        quick_commit_index_ = target_idx;
        lagging_sm_target_index_ = target_idx;
        p_db( "trigger commit upto %" PRIu64 "", quick_commit_index_.load() );

        // if this is a leader notify peers to commit as well
        // for peers that are free, send the request, otherwise,
        // set pending commit flag for that peer
        if (role_ == srv_role::leader) {
            for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
                ptr<peer> pp = it->second;
                if (!request_append_entries(pp)) {
                    pp->set_pending_commit();
                }
            }
        }
    }

    p_tr( "local log idx %" PRIu64 ", target_commit_idx %" PRIu64 ", "
          "quick_commit_index_ %" PRIu64 ", state_->get_commit_idx() %" PRIu64 "",
          log_store_->next_slot() - 1, target_idx,
          quick_commit_index_.load(), sm_commit_index_.load() );

    if ( log_store_->next_slot() - 1 > sm_commit_index_ &&
         quick_commit_index_ > sm_commit_index_ ) {

        nuraft_global_mgr* mgr = nuraft_global_mgr::get_instance();
        if (mgr) {
            // Global thread pool exists, request it.
            p_tr("request commit to global thread pool");
            mgr->request_commit( this->shared_from_this() );
        } else {
            p_tr("commit_cv_ notify (local thread)");
            std::unique_lock<std::mutex> lock(commit_cv_lock_);
            commit_cv_.notify_one();
        }

    } else {
        /*
         * After raft server (re-)start, if its log entry is as fresh as leader,
         * then commit thread will not be notified. But we need to tell the app,
         * whose status rely on raft server, that now raft server is fresh.
         */
        if (role_ == srv_role::follower) {
            ulong leader_idx = leader_commit_index_.load();
            ulong local_idx = sm_commit_index_.load();
            if (!data_fresh_.load() &&
                leader_idx < local_idx + ctx_->get_params()->fresh_log_gap_) {
                data_fresh_.store(true);
                cb_func::Param param(id_, leader_);
                (void) ctx_->cb_func_.call(cb_func::BecomeFresh, &param);
            }
        }
    }
}